

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

ImaginaryFloatingConstant * __thiscall
psy::TextElementTable<psy::C::ImaginaryFloatingConstant>::find
          (TextElementTable<psy::C::ImaginaryFloatingConstant> *this,char *chars,uint size)

{
  uint uVar1;
  int iVar2;
  char *__s1;
  TextElement *local_30;
  ImaginaryFloatingConstant *elem;
  uint h;
  uint size_local;
  char *chars_local;
  TextElementTable<psy::C::ImaginaryFloatingConstant> *this_local;
  
  if (this->buckets_ != (ImaginaryFloatingConstant **)0x0) {
    uVar1 = psy::TextElement::hashCode(chars,size);
    for (local_30 = (TextElement *)this->buckets_[(ulong)uVar1 % (ulong)(uint)this->bucketCount_];
        local_30 != (TextElement *)0x0; local_30 = *(TextElement **)&local_30[0x20].field_0x0) {
      uVar1 = TextElement::size(local_30);
      if (uVar1 == size) {
        __s1 = TextElement::c_str(local_30);
        iVar2 = strncmp(__s1,chars,(ulong)size);
        if (iVar2 == 0) {
          return (ImaginaryFloatingConstant *)local_30;
        }
      }
    }
  }
  return (ImaginaryFloatingConstant *)0x0;
}

Assistant:

const ElemT* find(const char* chars, unsigned int size) const
    {
        if (buckets_) {
            unsigned int h = ElemT::hashCode(chars, size);
            ElemT* elem = buckets_[h % bucketCount_];
            for (; elem; elem = static_cast<ElemT*>(elem->next_)) {
                if (elem->size() == size && !std::strncmp(elem->c_str(), chars, size))
                    return elem;
            }
        }
        return nullptr;
    }